

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O2

void embree::addCollisionConstraints(RTCScene scene)

{
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *this;
  ClothModel *this_00;
  uint *puVar1;
  CollisionConstraint *in_RAX;
  ulong uVar2;
  pointer pTVar3;
  RTCScene scene_00;
  pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> *coll;
  uint *puVar4;
  CollisionConstraint *local_38;
  
  this_00 = *(ClothModel **)(meshes + (ulong)clothID * 8);
  local_38 = in_RAX;
  collide2::ClothModel::clearCollisionConstraints(this_00);
  puVar1 = DAT_002b0d70;
  this = &this_00->c_constraints_;
  for (puVar4 = sim_collisions; puVar4 != puVar1; puVar4 = puVar4 + 4) {
    if ((clothID != *puVar4) && (clothID == puVar4[2])) {
      uVar2 = (ulong)puVar4[3];
      pTVar3 = (this_00->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      scene_00 = (RTCScene)
                 (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((*(float *)(scene_00 + (long)pTVar3[uVar2].v0 * 4) != 0.0) ||
         (NAN(*(float *)(scene_00 + (long)pTVar3[uVar2].v0 * 4)))) {
        local_38 = makeCollisionConstraint(scene_00,pTVar3[uVar2].v0,*puVar4,puVar4[1]);
        std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>::
        emplace_back<embree::collide2::Constraint*>
                  ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                    *)this,(Constraint **)&local_38);
        uVar2 = (ulong)puVar4[3];
        pTVar3 = (this_00->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        scene_00 = (RTCScene)
                   (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      if ((*(float *)(scene_00 + (long)pTVar3[uVar2].v1 * 4) != 0.0) ||
         (NAN(*(float *)(scene_00 + (long)pTVar3[uVar2].v1 * 4)))) {
        local_38 = makeCollisionConstraint(scene_00,pTVar3[uVar2].v1,*puVar4,puVar4[1]);
        std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>::
        emplace_back<embree::collide2::Constraint*>
                  ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                    *)this,(Constraint **)&local_38);
        uVar2 = (ulong)puVar4[3];
        pTVar3 = (this_00->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        scene_00 = (RTCScene)
                   (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      if ((*(float *)(scene_00 + (long)pTVar3[uVar2].v2 * 4) != 0.0) ||
         (NAN(*(float *)(scene_00 + (long)pTVar3[uVar2].v2 * 4)))) {
        local_38 = makeCollisionConstraint(scene_00,pTVar3[uVar2].v2,*puVar4,puVar4[1]);
        std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>::
        emplace_back<embree::collide2::Constraint*>
                  ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                    *)this,(Constraint **)&local_38);
      }
    }
  }
  return;
}

Assistant:

void addCollisionConstraints (RTCScene scene)
{
  auto & cloth = (collide2::ClothModel &) (*meshes[clothID]);
  cloth.clearCollisionConstraints();
  
  for (auto const & coll : sim_collisions) {
    auto & c0 = coll.first;
    auto & c1 = coll.second;

    // throw out self collisions for now
    if (clothID == c0.first && clothID == c1.first) continue;

    // push back cloth vertex constraints if not fixed
    if (clothID == c1.first) {
      if (cloth.m_inv_[cloth.tris_[c1.second].v0] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v0, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v1] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v1, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v2] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v2, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
    }
  }
}